

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

FunctionBody * __thiscall Js::Utf8SourceInfo::GetAnyParsedFunction(Utf8SourceInfo *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar4;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar5;
  FunctionBody **ppFVar6;
  ByteBlock *pBVar7;
  int local_24;
  FunctionBody *pFStack_20;
  int i;
  FunctionBody *functionBody;
  Utf8SourceInfo *this_local;
  
  functionBody = (FunctionBody *)this;
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizedDictionary__
                      ((WriteBarrierPtr *)&this->functionBodyDictionary);
  if (*ppSVar4 !=
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    pSVar5 = Memory::
             WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
             ::operator->(&this->functionBodyDictionary);
    iVar2 = JsUtil::
            SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
            ::Count(pSVar5);
    if (0 < iVar2) {
      pFStack_20 = (FunctionBody *)0x0;
      local_24 = 0;
      do {
        pSVar5 = Memory::
                 WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
                 ::operator->(&this->functionBodyDictionary);
        ppFVar6 = JsUtil::
                  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  ::GetValueAt(pSVar5,&local_24);
        pFStack_20 = *ppFVar6;
        if (((pFStack_20 != (FunctionBody *)0x0) &&
            (pBVar7 = FunctionBody::GetByteCode(pFStack_20), pBVar7 == (ByteBlock *)0x0)) &&
           (bVar1 = FunctionBody::GetIsFromNativeCodeModule(pFStack_20), !bVar1)) {
          pFStack_20 = (FunctionBody *)0x0;
        }
        iVar2 = local_24 + 1;
        bVar1 = false;
        local_24 = iVar2;
        if (pFStack_20 == (FunctionBody *)0x0) {
          pSVar5 = Memory::
                   WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
                   ::operator->(&this->functionBodyDictionary);
          iVar3 = JsUtil::
                  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  ::Count(pSVar5);
          bVar1 = iVar2 < iVar3;
        }
      } while (bVar1);
      return pFStack_20;
    }
  }
  return (FunctionBody *)0x0;
}

Assistant:

Js::FunctionBody* Utf8SourceInfo::GetAnyParsedFunction()
    {
        if (this->functionBodyDictionary != nullptr && this->functionBodyDictionary->Count() > 0)
        {
            FunctionBody* functionBody = nullptr;
            int i = 0;
            do
            {
                functionBody = this->functionBodyDictionary->GetValueAt(i);
                if (functionBody != nullptr && functionBody->GetByteCode() == nullptr && !functionBody->GetIsFromNativeCodeModule()) functionBody = nullptr;
                i++;
            }
            while (functionBody == nullptr && i < this->functionBodyDictionary->Count());

            return functionBody;
        }

        return nullptr;
    }